

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall
QDockWidgetGroupLayout::QDockWidgetGroupLayout
          (QDockWidgetGroupLayout *this,QDockWidgetGroupWindow *parent)

{
  void *pvVar1;
  QLayout *in_RSI;
  QWidget *in_RDI;
  QWidget *unaff_retaddr;
  QWidget *in_stack_00000008;
  QWidgetResizeHandler *in_stack_00000010;
  QDockAreaLayoutInfo *in_stack_ffffffffffffffe0;
  
  QLayout::QLayout(in_RSI,in_RDI);
  QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>::QMainWindowLayoutSeparatorHelper
            ((QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *)in_stack_ffffffffffffffe0);
  *(undefined ***)in_RDI = &PTR_metaObject_00d163e0;
  *(undefined ***)&in_RDI->super_QPaintDevice = &PTR__QDockWidgetGroupLayout_00d164e8;
  QDockAreaLayoutInfo::QDockAreaLayoutInfo(in_stack_ffffffffffffffe0);
  QDockAreaLayoutInfo::QDockAreaLayoutInfo(in_stack_ffffffffffffffe0);
  QLayout::setSizeConstraint(in_RSI,(SizeConstraint)((ulong)in_RDI >> 0x20));
  pvVar1 = operator_new(0x48);
  QWidgetResizeHandler::QWidgetResizeHandler(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  *(void **)&in_RDI[3].super_QPaintDevice = pvVar1;
  return;
}

Assistant:

QDockWidgetGroupLayout(QDockWidgetGroupWindow* parent) : QLayout(parent) {
        setSizeConstraint(QLayout::SetMinAndMaxSize);
        resizer = new QWidgetResizeHandler(parent);
    }